

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_io_thread.cpp
# Opt level: O1

int __thiscall
libtorrent::disk_io_thread::flush_range
          (disk_io_thread *this,cached_piece_entry *pe,int start,int end,jobqueue_t *completed_jobs,
          unique_lock<std::mutex> *l)

{
  long lVar1;
  undefined8 this_00;
  scoped_unlocker_impl<std::unique_lock<std::mutex>_> sVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  int *flushing;
  long TORRENT_ALLOCA_size;
  ulong uVar6;
  span<char> *__s;
  span<libtorrent::span<char>_> iov;
  span<const_int> flushing_00;
  span<const_libtorrent::span<char>_> iov_00;
  int aiStack_b0 [2];
  span<int> sStack_a8;
  int aiStack_98 [2];
  long lStack_90;
  span<char> sStack_88;
  ulong uStack_78;
  undefined1 local_70 [8];
  storage_error error;
  scoped_unlocker_impl<std::unique_lock<std::mutex>_> local_40;
  scoped_unlocker_impl<std::unique_lock<std::mutex>_> unlocker;
  undefined8 uVar5;
  
  error._16_8_ = l;
  unlocker.m_lock = (unique_lock<std::mutex> *)this;
  lVar1 = -(ulong)(((uint)(*(ulong *)&pe->field_0x7c >> 0x20) & 0x3fff) << 4);
  __s = (span<char> *)((long)&sStack_88 + lVar1);
  uVar6 = *(ulong *)&pe->field_0x7c >> 0x20 & 0x3fff;
  if (uVar6 != 0) {
    *(undefined8 *)((long)&lStack_90 + lVar1) = 0x330ca7;
    memset(__s,0,(ulong)(uint)((int)uVar6 << 4));
  }
  flushing = (int *)((long)__s - (ulong)((int)uVar6 * 4 + 0xfU & 0xfffffff0));
  sStack_88.m_len = (difference_type)flushing;
  uStack_78 = uVar6;
  *(int **)(flushing + -8) = flushing;
  *(ulong *)(flushing + -6) = uVar6;
  flushing[-4] = 0;
  sVar2 = unlocker;
  flushing[-10] = 0x330cec;
  flushing[-9] = 0;
  iov.m_len = (difference_type)l;
  iov.m_ptr = __s;
  iVar4 = build_iovec((disk_io_thread *)sVar2.m_lock,pe,start,end,iov,*(span<int> *)(flushing + -8),
                      flushing[-4]);
  this_00 = error._16_8_;
  uVar5 = CONCAT44(extraout_var,iVar4);
  if (iVar4 == 0) {
    uVar5 = 0;
  }
  else {
    local_70._0_4_ = 0;
    local_70[4] = false;
    error.ec._0_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
    error.ec.cat_._0_4_ = 0xffffff;
    uVar6 = *(ulong *)&pe->field_0x7c + 0x20000000000000 & 0xfe0000000000000;
    *(ulong *)&pe->field_0x7c = *(ulong *)&pe->field_0x7c & 0xf01fffffffffffff | uVar6;
    local_40.m_lock = (unique_lock<std::mutex> *)error._16_8_;
    flushing[-2] = 0x330d58;
    flushing[-1] = 0;
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)this_00);
    sVar2 = unlocker;
    *(undefined1 **)(flushing + -2) = local_70;
    *(undefined8 *)(flushing + -4) = uVar5;
    flushing[-6] = 0x330d78;
    flushing[-5] = 0;
    flushing_00.m_len = (difference_type)l;
    flushing_00.m_ptr = flushing;
    iov_00.m_len = uVar6;
    iov_00.m_ptr = __s;
    flush_iovec((disk_io_thread *)sVar2.m_lock,pe,iov_00,flushing_00,flushing[-4],
                *(storage_error **)(flushing + -2));
    flushing[-2] = 0x330d85;
    flushing[-1] = 0;
    anon_unknown_0::scoped_unlocker_impl<std::unique_lock<std::mutex>_>::~scoped_unlocker_impl
              (&local_40);
    *(ulong *)&pe->field_0x7c =
         *(ulong *)&pe->field_0x7c & 0xf01fffffffffffff |
         *(ulong *)&pe->field_0x7c + 0xfe0000000000000 & 0xfe0000000000000;
    *(jobqueue_t **)(flushing + -4) = completed_jobs;
    flushing[-6] = 0x330dc3;
    flushing[-5] = 0;
    bVar3 = iovec_flushed((disk_io_thread *)sVar2.m_lock,pe,flushing,iVar4,0,
                          (storage_error *)local_70,*(jobqueue_t **)(flushing + -4));
    if (!bVar3) {
      flushing[-2] = 0x330ddb;
      flushing[-1] = 0;
      block_cache::maybe_free_piece((block_cache *)(sVar2.m_lock + 0x3a),pe);
    }
    flushing[-2] = 0x330dec;
    flushing[-1] = 0;
    iVar4 = disk_buffer_pool::num_to_evict((disk_buffer_pool *)(sVar2.m_lock + 0x3a),0);
    if (0 < iVar4) {
      flushing[-2] = 0x330dfc;
      flushing[-1] = 0;
      block_cache::try_evict_blocks
                ((block_cache *)(sVar2.m_lock + 0x3a),iVar4,(cached_piece_entry *)0x0);
    }
  }
  return (int)uVar5;
}

Assistant:

int disk_io_thread::flush_range(cached_piece_entry* pe, int const start, int const end
		, jobqueue_t& completed_jobs, std::unique_lock<std::mutex>& l)
	{
		TORRENT_ASSERT(l.owns_lock());

		DLOG("flush_range: piece=%d [%d, %d)\n"
			, static_cast<int>(pe->piece), start, end);
		TORRENT_PIECE_ASSERT(start >= 0, pe);
		TORRENT_PIECE_ASSERT(start < end, pe);

		TORRENT_ALLOCA(iov, iovec_t, pe->blocks_in_piece);
		TORRENT_ALLOCA(flushing, int, pe->blocks_in_piece);
		int const iov_len = build_iovec(pe, start, end, iov, flushing, 0);
		if (iov_len == 0) return 0;

		TORRENT_PIECE_ASSERT(pe->cache_state <= cached_piece_entry::read_lru1 || pe->cache_state == cached_piece_entry::read_lru2, pe);
#if TORRENT_USE_ASSERTS
		pe->piece_log.push_back(piece_log_t(piece_log_t::flush_range, -1));
#endif

		storage_error error;
		{
			piece_refcount_holder refcount_holder(pe);
			auto unlocker = scoped_unlock(l);

			flush_iovec(pe, iov, flushing, iov_len, error);
		}

		if (!iovec_flushed(pe, flushing.data(), iov_len, 0, error, completed_jobs))
			m_disk_cache.maybe_free_piece(pe);

		// if the cache is under high pressure, we need to evict
		// the blocks we just flushed to make room for more write pieces
		int const evict = m_disk_cache.num_to_evict(0);
		if (evict > 0) m_disk_cache.try_evict_blocks(evict);

		return iov_len;
	}